

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O0

int png_get_data(png_t *png,uchar *data)

{
  undefined8 *in_RDI;
  uchar *unaff_retaddr;
  png_t *in_stack_00000008;
  int result;
  png_t *in_stack_ffffffffffffffd8;
  int local_1c;
  int local_4;
  
  local_1c = 0;
  in_RDI[4] = 0;
  *in_RDI = 0;
  while (local_1c == 0) {
    local_1c = png_process_chunk(in_stack_ffffffffffffffd8);
  }
  if (local_1c == 1) {
    local_4 = png_unfilter(in_stack_00000008,unaff_retaddr);
    (*png_free)((void *)in_RDI[4]);
    in_RDI[4] = 0;
  }
  else {
    if (in_RDI[4] == 0) {
      (*png_free)((void *)in_RDI[4]);
      in_RDI[4] = 0;
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

int png_get_data(png_t* png, unsigned char* data)
{
	int result = PNG_NO_ERROR;
	png->png_data = 0;
	png->zs = 0;

	while(result == PNG_NO_ERROR)
	{
		result = png_process_chunk(png);
	}

	if(result != PNG_DONE)
	{
		if(!png->png_data)
		{
			png_free(png->png_data);
			png->png_data = 0;
		}
		return result;
	}

	result = png_unfilter(png, data);

	png_free(png->png_data); 
	png->png_data = 0;

	return result;
}